

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condvar.c
# Opt level: O1

int nn_condvar_wait(nn_condvar_t *cond,nn_mutex_t *lock,int timeout)

{
  int iVar1;
  int iVar2;
  timeval tv;
  timespec ts;
  timeval local_40;
  timespec local_30;
  
  if (timeout < 0) {
    pthread_cond_wait((pthread_cond_t *)cond,(pthread_mutex_t *)lock);
    iVar1 = 0;
  }
  else {
    iVar1 = gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    if (iVar1 != 0) {
      nn_condvar_wait_cold_1();
    }
    local_40.tv_sec = local_40.tv_sec + (ulong)(uint)timeout / 1000;
    local_40.tv_usec = (ulong)(((uint)timeout % 1000) * 1000) + local_40.tv_usec;
    local_30.tv_sec = local_40.tv_sec + local_40.tv_usec / 1000000;
    local_30.tv_nsec = (local_40.tv_usec % 1000000) * 1000;
    iVar2 = pthread_cond_timedwait((pthread_cond_t *)cond,(pthread_mutex_t *)lock,&local_30);
    iVar1 = 0;
    if (iVar2 == 0x6e) {
      iVar1 = -0x6e;
    }
  }
  return iVar1;
}

Assistant:

int nn_condvar_wait (nn_condvar_t *cond, nn_mutex_t *lock, int timeout)
{
    int rc;
    struct timeval tv;
    struct timespec ts;

    if (timeout < 0) {
        /*  This is an infinite sleep.  We don't care about return values,
            as any error we can treat as just a premature wakeup. */
        (void) pthread_cond_wait (&cond->cv, &lock->mutex);
        return (0);
    }

    rc = gettimeofday(&tv, NULL);
    errnum_assert (rc == 0, rc);

    /* There are extra operations performed here, but they are done to avoid
       wrap of the tv_usec and ts_nsec members on 32-bit systems. */
    tv.tv_sec += timeout / 1000;
    tv.tv_usec += (timeout % 1000) * 1000;

    ts.tv_sec = tv.tv_sec + (tv.tv_usec / 1000000);
    ts.tv_nsec = (tv.tv_usec % 1000000) * 1000;

    rc = pthread_cond_timedwait (&cond->cv, &lock->mutex, &ts);
    if (rc == ETIMEDOUT)
        return (-ETIMEDOUT);
    /* Treat all other cases (including errors) as normal wakeup. */
    return (0);
}